

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O0

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::~BufferBase
          (BufferBase<Diligent::EngineVkImplTraits> *this)

{
  code *pcVar1;
  BufferBase<Diligent::EngineVkImplTraits> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~BufferBase()
    {
        if (m_DynamicBufferId != ~0u)
        {
            this->m_pDevice->RecycleDynamicBufferId(m_DynamicBufferId);
        }
    }